

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O2

void __thiscall MeCab::Param::dump_config(Param *this,ostream *os)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->conf_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->conf_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(os,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void Param::dump_config(std::ostream *os) const {
  for (std::map<std::string, std::string>::const_iterator it = conf_.begin();
       it != conf_.end();
       ++it) {
    *os << it->first << ": " << it->second << std::endl;
  }
}